

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::damage_zone(Fl_Table *this,int r1,int c1,int r2,int c2,int r3,int c3)

{
  int local_34;
  int local_30;
  int C2;
  int R2;
  int C1;
  int R1;
  int r3_local;
  int c2_local;
  int r2_local;
  int c1_local;
  int r1_local;
  Fl_Table *this_local;
  
  R2 = r1;
  local_30 = r2;
  if (r2 < r1) {
    R2 = r2;
    local_30 = r1;
  }
  if (local_30 < r3) {
    local_30 = r3;
  }
  if (r3 < R2) {
    R2 = r3;
  }
  C2 = c1;
  local_34 = c2;
  if (c2 < c1) {
    C2 = c2;
    local_34 = c1;
  }
  if (local_34 < c3) {
    local_34 = c3;
  }
  if (c3 < C2) {
    C2 = c3;
  }
  if (R2 < 0) {
    if (local_30 < 0) {
      return;
    }
    R2 = 0;
  }
  if (C2 < 0) {
    if (local_34 < 0) {
      return;
    }
    C2 = 0;
  }
  if (R2 < this->toprow) {
    R2 = this->toprow;
  }
  if (this->botrow < local_30) {
    local_30 = this->botrow;
  }
  if (C2 < this->leftcol) {
    C2 = this->leftcol;
  }
  if (this->rightcol < local_34) {
    local_34 = this->rightcol;
  }
  redraw_range(this,R2,local_30,C2,local_34);
  return;
}

Assistant:

void Fl_Table::damage_zone(int r1, int c1, int r2, int c2, int r3, int c3) {
  int R1 = r1, C1 = c1;
  int R2 = r2, C2 = c2;
  if (r1 > R2) R2 = r1;
  if (r2 < R1) R1 = r2;
  if (r3 > R2) R2 = r3;
  if (r3 < R1) R1 = r3;
  if (c1 > C2) C2 = c1;
  if (c2 < C1) C1 = c2;
  if (c3 > C2) C2 = c3;
  if (c3 < C1) C1 = c3;
  if (R1 < 0) {
    if (R2 < 0) return;
    R1 = 0;
  }
  if (C1 < 0) {
    if (C2 < 0) return;
    C1 = 0;
  }
  if (R1 < toprow) R1 = toprow;
  if (R2 > botrow) R2 = botrow;
  if (C1 < leftcol) C1 = leftcol;
  if (C2 > rightcol) C2 = rightcol;
  redraw_range(R1, R2, C1, C2);
}